

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen12Platform.cpp
# Opt level: O1

uint8_t __thiscall
GmmLib::PlatformInfoGen12::OverrideCompressionFormat
          (PlatformInfoGen12 *this,GMM_RESOURCE_FORMAT Format,uint8_t IsMC)

{
  anon_struct_8_38_77a33f9e_for__SKU_FEATURE_TABLE_2 aVar1;
  byte bVar2;
  byte bVar3;
  
  bVar2 = (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.
          FormatTable[Format].CompressionFormat.CompressionFormat;
  aVar1 = (((this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.
           pGmmLibContext)->SkuTable).field_1;
  if (((ulong)aVar1 >> 0x22 & 1) != 0) {
    if (0xf < bVar2) {
      return 0x10;
    }
    return bVar2;
  }
  if (((ulong)aVar1 & 0x42000000) == 0) {
    return bVar2;
  }
  bVar3 = bVar2;
  if (7 < bVar2) {
    bVar3 = 0x30;
  }
  if ((aVar1._0_4_ >> 0x1e & 1) != 0) {
    bVar3 = bVar2;
  }
  if (IsMC == '\0') {
    bVar2 = 0x30;
    if (bVar3 < 0x20) {
      bVar2 = bVar3;
    }
    if (((ulong)aVar1 & 0x40000000) != 0) {
      return bVar2;
    }
    return bVar3;
  }
  if ((aVar1._0_4_ >> 0x1e & 1) == 0) {
    if ((byte)(bVar2 - 0x21) < 0xf) {
LAB_0019c26c:
      return bVar2 - 0x20;
    }
    if (bVar2 == 3) {
      bVar3 = 0x2e;
    }
    else if (bVar2 == 2) {
      bVar3 = 0x2a;
    }
    else if (bVar2 == 0) {
      bVar3 = 0x21;
    }
    else {
      bVar3 = bVar2;
      if ((byte)(bVar2 - 0x30) < 0xf1) {
        bVar3 = 0x30;
      }
    }
  }
  else {
    if ((byte)(bVar2 - 0x21) < 0xf) goto LAB_0019c26c;
    bVar3 = bVar2 - 4;
    if ((bVar3 < 9) && ((0x133U >> (bVar3 & 0x1f) & 1) != 0)) {
      bVar3 = "!!..**..."[bVar3];
    }
    else {
      bVar3 = 0x30;
      if (0xf0 < (byte)(bVar2 - 0x30)) {
        bVar3 = bVar2;
      }
    }
  }
  bVar2 = 0x30;
  if (bVar3 != 0x30) {
    bVar2 = bVar3 - 0x20;
  }
  return bVar2;
}

Assistant:

uint8_t GmmLib::PlatformInfoGen12::OverrideCompressionFormat(GMM_RESOURCE_FORMAT Format, uint8_t IsMC)
{

    uint8_t CompressionFormat = Data.FormatTable[Format].CompressionFormat.CompressionFormat;
    if (pGmmLibContext->GetSkuTable().FtrXe2Compression)
    {
        if ((CompressionFormat < GMM_XE2_UNIFIED_COMP_MIN_FORMAT) ||
            (CompressionFormat > GMM_XE2_UNIFIED_COMP_MAX_FORMAT))
        {
            CompressionFormat = GMM_XE2_UNIFIED_COMP_FORMAT_INVALID;
        }
        __GMM_ASSERT(CompressionFormat != GMM_XE2_UNIFIED_COMP_FORMAT_INVALID);
    }
    else if (pGmmLibContext->GetSkuTable().FtrFlatPhysCCS || pGmmLibContext->GetSkuTable().FtrUnified3DMediaCompressionFormats)
    {
        if(!IsMC &&
           !pGmmLibContext->GetSkuTable().FtrUnified3DMediaCompressionFormats &&
           (CompressionFormat < GMM_FLATCCS_MIN_RC_FORMAT ||
            CompressionFormat > GMM_FLATCCS_MAX_RC_FORMAT))
        {
            CompressionFormat = GMM_FLATCCS_FORMAT_INVALID;
        }

	if(!IsMC &&
           pGmmLibContext->GetSkuTable().FtrUnified3DMediaCompressionFormats &&
           (CompressionFormat < GMM_UNIFIED_COMP_MIN_RC_FORMAT ||
            CompressionFormat > GMM_UNIFIED_COMP_MAX_RC_FORMAT))
        {
            CompressionFormat = GMM_UNIFIED_COMP_FORMAT_INVALID;
        }
	else if(IsMC)
        {
            if(!pGmmLibContext->GetSkuTable().FtrUnified3DMediaCompressionFormats)
            {
		if(CompressionFormat >= GMM_FLATCCS_MIN_MC_FORMAT && CompressionFormat <= GMM_FLATCCS_MAX_MC_FORMAT)
                {
                    //True MC format encodings, drop MC-identify bit (ie bit5)
                    CompressionFormat -= (GMM_FLATCCS_MIN_MC_FORMAT - 1);
                }
                else
                {
                    // RC format encoding, needs MC format encoding for MC usage
                    switch(CompressionFormat)
                    {
                        case GMM_FLATCCS_FORMAT_RGB10A2:
                            CompressionFormat = GMM_FLATCCS_FORMAT_RGB10b;
                            break;
                        case GMM_FLATCCS_FORMAT_RGBA16U:
                            CompressionFormat = GMM_FLATCCS_FORMAT_RGBA16_MEDIA;
                            break;
                        case GMM_FLATCCS_FORMAT_RGBA8U:
                            CompressionFormat = GMM_FLATCCS_FORMAT_ARGB8b;
                            break;
                        default:
                            if(CompressionFormat < GMM_FLATCCS_MIN_MC_FORMAT || CompressionFormat > GMM_FLATCCS_MAX_MC_FORMAT)
                            {
                                CompressionFormat = GMM_FLATCCS_FORMAT_INVALID;
                            }
                            break;
                    }

                    if(CompressionFormat != GMM_FLATCCS_FORMAT_INVALID)
                    {
                        //drop MC-identify bit (ie bit 5)
                        CompressionFormat -= (GMM_FLATCCS_MIN_MC_FORMAT - 1);
                    }
                }
	    }
            else
            {
                if(CompressionFormat >= GMM_UNIFIED_COMP_MIN_MC_FORMAT && CompressionFormat <= GMM_UNIFIED_COMP_MAX_MC_FORMAT)
                {
                    //True MC format encodings, drop MC-identify bit (ie bit5)
                    CompressionFormat -= (GMM_UNIFIED_COMP_MIN_MC_FORMAT - 1);
                }
                else
                {
                    // RC format encoding, needs MC format encoding for MC usage
                    switch(CompressionFormat)
                    {
                        case GMM_UNIFIED_COMP_FORMAT_RGB10A2:
                            CompressionFormat = GMM_UNIFIED_COMP_FORMAT_RGB10b;
                            break;
                        case GMM_UNIFIED_COMP_FORMAT_RGBA16U:
                        case GMM_UNIFIED_COMP_FORMAT_RGBA16F:
                            CompressionFormat = GMM_UNIFIED_COMP_FORMAT_RGBA16_MEDIA;
                            break;
                        case GMM_UNIFIED_COMP_FORMAT_RGBA8U:
                        case GMM_UNIFIED_COMP_FORMAT_RGBA8S:
                            CompressionFormat = GMM_UNIFIED_COMP_FORMAT_ARGB8b;
                            break;
                        default:
                            if(CompressionFormat < GMM_UNIFIED_COMP_MIN_MC_FORMAT || CompressionFormat > GMM_UNIFIED_COMP_MAX_MC_FORMAT)
                            {
                                CompressionFormat = GMM_UNIFIED_COMP_FORMAT_INVALID;
                            }
                            break;
                    }

                    if(CompressionFormat != GMM_UNIFIED_COMP_FORMAT_INVALID)
                    {
                        //drop MC-identify bit (ie bit 5)
                        CompressionFormat -= (GMM_UNIFIED_COMP_MIN_MC_FORMAT - 1);
                    }
		}
	    }
        }

	//Assert if out of MC/RC encoding range -ie format-table must be corrected for Compression code
        __GMM_ASSERT(!pGmmLibContext->GetSkuTable().FtrUnified3DMediaCompressionFormats && CompressionFormat != GMM_FLATCCS_FORMAT_INVALID ||
                     pGmmLibContext->GetSkuTable().FtrUnified3DMediaCompressionFormats && CompressionFormat != GMM_UNIFIED_COMP_FORMAT_INVALID);
    }

    return CompressionFormat;
}